

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int blobReadWrite(sqlite3_blob *pBlob,void *z,int n,int iOffset,
                 _func_int_BtCursor_ptr_u32_u32_void_ptr *xCall)

{
  int *piVar1;
  sqlite3 *db;
  Vdbe *p;
  Btree *pBVar2;
  int err_code;
  int iVar3;
  BtCursor *pBVar4;
  
  if (pBlob == (sqlite3_blob *)0x0) {
    iVar3 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x192f4,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  else {
    db = *(sqlite3 **)(pBlob + 0x20);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    err_code = 1;
    if ((-1 < (iOffset | n)) &&
       ((long)((ulong)(uint)n + (ulong)(uint)iOffset) <= (long)*(int *)pBlob)) {
      p = *(Vdbe **)(pBlob + 0x18);
      err_code = 4;
      if (p != (Vdbe *)0x0) {
        pBVar4 = *(BtCursor **)(pBlob + 0x10);
        pBVar2 = pBVar4->pBtree;
        if ((pBVar2->sharable != '\0') &&
           (pBVar2->wantToLock = pBVar2->wantToLock + 1, pBVar2->locked == '\0')) {
          btreeLockCarefully(pBVar2);
          pBVar4 = *(BtCursor **)(pBlob + 0x10);
        }
        err_code = (*xCall)(pBVar4,iOffset + *(int *)(pBlob + 4),n,z);
        pBVar2 = *(Btree **)(*(long *)(pBlob + 0x10) + 8);
        if (pBVar2->sharable != '\0') {
          piVar1 = &pBVar2->wantToLock;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            unlockBtreeMutex(pBVar2);
          }
        }
        if (err_code == 4) {
          sqlite3VdbeFinalize(p);
          *(undefined8 *)(pBlob + 0x18) = 0;
          err_code = 4;
        }
        else {
          p->rc = err_code;
        }
      }
    }
    sqlite3Error(db,err_code);
    if ((err_code != 0) || (iVar3 = 0, db->mallocFailed != '\0')) {
      iVar3 = apiHandleError(db,err_code);
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return iVar3;
}

Assistant:

static int blobReadWrite(
  sqlite3_blob *pBlob,
  void *z,
  int n,
  int iOffset,
  int (*xCall)(BtCursor*, u32, u32, void*)
){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  Vdbe *v;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);
  v = (Vdbe*)p->pStmt;

  if( n<0 || iOffset<0 || ((sqlite3_int64)iOffset+n)>p->nByte ){
    /* Request is out of range. Return a transient error. */
    rc = SQLITE_ERROR;
  }else if( v==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    /* Call either BtreeData() or BtreePutData(). If SQLITE_ABORT is
    ** returned, clean-up the statement handle.
    */
    assert( db == v->db );
    sqlite3BtreeEnterCursor(p->pCsr);

#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    if( xCall==sqlite3BtreePutData && db->xPreUpdateCallback ){
      /* If a pre-update hook is registered and this is a write cursor,
      ** invoke it here.
      **
      ** TODO: The preupdate-hook is passed SQLITE_DELETE, even though this
      ** operation should really be an SQLITE_UPDATE. This is probably
      ** incorrect, but is convenient because at this point the new.* values
      ** are not easily obtainable. And for the sessions module, an
      ** SQLITE_UPDATE where the PK columns do not change is handled in the
      ** same way as an SQLITE_DELETE (the SQLITE_DELETE code is actually
      ** slightly more efficient). Since you cannot write to a PK column
      ** using the incremental-blob API, this works. For the sessions module
      ** anyhow.
      */
      sqlite3_int64 iKey;
      iKey = sqlite3BtreeIntegerKey(p->pCsr);
      assert( v->apCsr[0]!=0 );
      assert( v->apCsr[0]->eCurType==CURTYPE_BTREE );
      sqlite3VdbePreUpdateHook(
          v, v->apCsr[0], SQLITE_DELETE, p->zDb, p->pTab, iKey, -1, p->iCol
      );
    }
#endif

    rc = xCall(p->pCsr, iOffset+p->iOffset, n, z);
    sqlite3BtreeLeaveCursor(p->pCsr);
    if( rc==SQLITE_ABORT ){
      sqlite3VdbeFinalize(v);
      p->pStmt = 0;
    }else{
      v->rc = rc;
    }
  }
  sqlite3Error(db, rc);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}